

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>&,char_const(&)[7],pstore::command_line::desc_const&,pstore::command_line::details::values_const&,pstore::command_line::details::initializer<endian>const&>
               (opt<endian,_pstore::command_line::parser<endian,_void>_> *opt,char (*m0) [7],
               desc *mods,values *mods_1,initializer<endian> *mods_2)

{
  string sStack_48;
  
  make_modifier((name *)&sStack_48,*m0);
  option::set_name(&opt->super_option,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  apply_to_option<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>&,pstore::command_line::desc_const&,pstore::command_line::details::values_const&,pstore::command_line::details::initializer<endian>const&>
            (opt,mods,mods_1,mods_2);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }